

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

ImportSourcePtr __thiscall libcellml::AnyCellmlElement::importSource(AnyCellmlElement *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  shared_ptr<libcellml::ImportSource> sVar2;
  ImportSourcePtr IVar3;
  bad_any_cast *anon_var_0;
  AnyCellmlElement *this_local;
  
  if (*(int *)*in_RSI == 4) {
    sVar2 = std::any_cast<std::shared_ptr<libcellml::ImportSource>>((any *)this);
    _Var1 = sVar2.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  else {
    std::shared_ptr<libcellml::ImportSource>::shared_ptr
              ((shared_ptr<libcellml::ImportSource> *)this,(nullptr_t)0x0);
    _Var1._M_pi = extraout_RDX;
  }
  IVar3.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  IVar3.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ImportSourcePtr)
         IVar3.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ImportSourcePtr AnyCellmlElement::importSource() const
{
    if (mPimpl->mType == CellmlElementType::IMPORT) {
        try {
            return std::any_cast<ImportSourcePtr>(mPimpl->mItem);
        } catch (const std::bad_any_cast &) {
            return nullptr;
        }
    }

    return nullptr;
}